

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void ProcessPendingTelemetryMessages(PMQTTTRANSPORT_HANDLE_DATA transport_data)

{
  _Bool _Var1;
  int iVar2;
  MQTT_MESSAGE_DETAILS_LIST *in_stack_ffffffffffffff78;
  uchar *local_68;
  uchar *messagePayload;
  size_t messageLength;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DLIST_ENTRY nextListEntry;
  MQTT_MESSAGE_DETAILS_LIST *msg_detail_entry;
  tickcounter_ms_t current_ms;
  PDLIST_ENTRY current_entry;
  PMQTTTRANSPORT_HANDLE_DATA transport_data_local;
  
  current_ms = (tickcounter_ms_t)(transport_data->telemetry_waitingForAck).Flink;
  current_entry = (PDLIST_ENTRY)transport_data;
  tickcounter_get_current_ms(transport_data->msgTickCounter,(tickcounter_ms_t *)&msg_detail_entry);
  while ((DLIST_ENTRY_TAG **)current_ms != &current_entry[0xf].Blink) {
    nextListEntry.Blink = (DLIST_ENTRY_TAG *)(current_ms - 0x28);
    l = *(LOGGER_LOG *)current_ms;
    if ((ulong)((long)msg_detail_entry - (long)(nextListEntry.Blink)->Flink) / 1000 < 0x78) {
      if (0x3c < (ulong)((long)msg_detail_entry - *(long *)(current_ms - 0x20)) / 1000) {
        if (*(int *)&current_entry[0xf].Flink == 0x30) {
          messageLength = (size_t)xlogging_get_log_function();
          if ((LOGGER_LOG)messageLength != (LOGGER_LOG)0x0) {
            in_stack_ffffffffffffff78 = msg_detail_entry;
            (*(code *)messageLength)
                      (AZ_LOG_INFO,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"ProcessPendingTelemetryMessages",0x9d2,1,
                       "Publish MQTT packet timeout. current_ms:%lu, msgPublishTime:%lu, msgCreationTime:%lu, packet_id:%d"
                       ,msg_detail_entry,(nextListEntry.Blink)->Blink,(nextListEntry.Blink)->Flink,
                       (uint)*(ushort *)&nextListEntry.Blink[2].Flink);
          }
          local_68 = (uchar *)0x0;
          _Var1 = RetrieveMessagePayload
                            ((IOTHUB_MESSAGE_HANDLE)(nextListEntry.Blink[1].Flink)->Flink,&local_68,
                             (size_t *)&messagePayload);
          if (_Var1) {
            iVar2 = publishTelemetryMsg((PMQTTTRANSPORT_HANDLE_DATA)current_entry,
                                        (MQTT_MESSAGE_DETAILS_LIST *)nextListEntry.Blink,local_68,
                                        (size_t)messagePayload,true);
            if (iVar2 != 0) {
              DList_RemoveEntryList((PDLIST_ENTRY)current_ms);
              notifyApplicationOfSendMessageComplete
                        ((IOTHUB_MESSAGE_LIST *)nextListEntry.Blink[1].Flink,
                         (PMQTTTRANSPORT_HANDLE_DATA)current_entry,IOTHUB_CLIENT_CONFIRMATION_ERROR)
              ;
              free(nextListEntry.Blink);
            }
          }
          else {
            DList_RemoveEntryList((PDLIST_ENTRY)current_ms);
            notifyApplicationOfSendMessageComplete
                      ((IOTHUB_MESSAGE_LIST *)nextListEntry.Blink[1].Flink,
                       (PMQTTTRANSPORT_HANDLE_DATA)current_entry,IOTHUB_CLIENT_CONFIRMATION_ERROR);
          }
        }
        else {
          *(MQTT_MESSAGE_DETAILS_LIST **)(current_ms - 0x20) = msg_detail_entry;
        }
      }
    }
    else {
      notifyApplicationOfSendMessageComplete
                (*(IOTHUB_MESSAGE_LIST **)(current_ms - 0x18),
                 (PMQTTTRANSPORT_HANDLE_DATA)current_entry,
                 IOTHUB_CLIENT_CONFIRMATION_MESSAGE_TIMEOUT);
      DList_RemoveEntryList((PDLIST_ENTRY)current_ms);
      l_1 = xlogging_get_log_function();
      if (l_1 != (LOGGER_LOG)0x0) {
        in_stack_ffffffffffffff78 =
             (MQTT_MESSAGE_DETAILS_LIST *)
             CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (uint)*(ushort *)&nextListEntry.Blink[2].Flink);
        (*l_1)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,"ProcessPendingTelemetryMessages",0x9c6,1,
               "Disconnecting MQTT connection because message PUBACK (%d) timeout.",
               in_stack_ffffffffffffff78);
      }
      free(nextListEntry.Blink);
      DisconnectFromClient((PMQTTTRANSPORT_HANDLE_DATA)current_entry);
      (*(code *)current_entry[0x13].Flink)(1,5,current_entry[0x16].Blink);
    }
    current_ms = (tickcounter_ms_t)l;
  }
  return;
}

Assistant:

static void ProcessPendingTelemetryMessages(PMQTTTRANSPORT_HANDLE_DATA transport_data)
{
    PDLIST_ENTRY current_entry = transport_data->telemetry_waitingForAck.Flink;
    tickcounter_ms_t current_ms;
    (void)tickcounter_get_current_ms(transport_data->msgTickCounter, &current_ms);
    while (current_entry != &transport_data->telemetry_waitingForAck)
    {
        MQTT_MESSAGE_DETAILS_LIST* msg_detail_entry = containingRecord(current_entry, MQTT_MESSAGE_DETAILS_LIST, entry);
        DLIST_ENTRY nextListEntry;
        nextListEntry.Flink = current_entry->Flink;

        if (((current_ms - msg_detail_entry->msgCreationTime) / 1000) >= TELEMETRY_MSG_TIMEOUT_MIN)
        {
            notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_MESSAGE_TIMEOUT);
            (void)DList_RemoveEntryList(current_entry);
            LogError("Disconnecting MQTT connection because message PUBACK (%d) timeout.", msg_detail_entry->packet_id);
            free(msg_detail_entry);

            DisconnectFromClient(transport_data);
            transport_data->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR, transport_data->transport_ctx);
        }
        else if (((current_ms - msg_detail_entry->msgPublishTime) / 1000) > RESEND_TIMEOUT_VALUE_MIN)
        {
            // Ensure that the packet state is PUBLISH_TYPE and then attempt to send the message
            // again
            if (transport_data->currPacketState == PUBLISH_TYPE)
            {
                LogInfo("Publish MQTT packet timeout. current_ms:%" PRIu64 ", msgPublishTime:%" PRIu64 ", msgCreationTime:%" PRIu64 ", packet_id:%d", (uint64_t)current_ms, (uint64_t)msg_detail_entry->msgPublishTime, (uint64_t)msg_detail_entry->msgCreationTime, msg_detail_entry->packet_id);
                size_t messageLength;
                const unsigned char* messagePayload = NULL;
                if (!RetrieveMessagePayload(msg_detail_entry->iotHubMessageEntry->messageHandle, &messagePayload, &messageLength))
                {
                    (void)DList_RemoveEntryList(current_entry);
                    notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_ERROR);
                }
                else
                {
                    if (publishTelemetryMsg(transport_data, msg_detail_entry, messagePayload, messageLength, MQTT_MESSAGE_DUP_FLAG_TRUE) != 0)
                    {
                        (void)DList_RemoveEntryList(current_entry);
                        notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_ERROR);
                        free(msg_detail_entry);
                    }
                }
            }
            else
            {
                msg_detail_entry->msgPublishTime = current_ms;
            }
        }
        current_entry = nextListEntry.Flink;
    }
}